

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniball.hpp
# Opt level: O3

void __thiscall
Miniball::
Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
::pivot_mb(Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
           *this,Pit n)

{
  _List_node_base *p_Var1;
  Pit PVar2;
  bool bVar3;
  _List_node_base *p_Var4;
  float **ppfVar5;
  long lVar6;
  Pit pit;
  float fVar7;
  float fVar8;
  float fVar9;
  NT NVar10;
  
  NVar10 = this->current_sqr_r;
  do {
    ppfVar5 = (this->points_begin)._M_current;
    if (ppfVar5 != n._M_current) {
      pit._M_current = ppfVar5;
      fVar7 = this->nt0;
      do {
        fVar8 = -NVar10;
        if (0 < this->d) {
          lVar6 = 0;
          do {
            fVar9 = (*ppfVar5)[lVar6] - this->current_c[lVar6];
            fVar8 = fVar8 + fVar9 * fVar9;
            lVar6 = lVar6 + 1;
          } while (this->d != (int)lVar6);
        }
        PVar2._M_current = ppfVar5;
        if (fVar8 <= fVar7) {
          fVar8 = fVar7;
          PVar2._M_current = pit._M_current;
        }
        pit._M_current = PVar2._M_current;
        fVar7 = fVar8;
        ppfVar5 = ppfVar5 + 1;
      } while (ppfVar5 != n._M_current);
      if (this->nt0 < fVar7) {
        p_Var4 = (this->L).
                 super__List_base<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        p_Var1 = (this->support_end)._M_node;
        if (p_Var4 == p_Var1) {
LAB_0010e0e6:
          if (p_Var4 != p_Var1) goto LAB_0010e136;
        }
        else {
          do {
            if (p_Var4[1]._M_next == (_List_node_base *)pit._M_current) goto LAB_0010e0e6;
            p_Var4 = p_Var4->_M_next;
          } while (p_Var4 != p_Var1);
        }
        if (this->fsize != 0) {
          __assert_fail("fsize == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/kmeans/../miniball/miniball.hpp"
                        ,0x18a,
                        "void Miniball::Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>>::pivot_mb(Pit) [CoordAccessor = Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>]"
                       );
        }
        bVar3 = push(this,pit);
        if (bVar3) {
          mtf_mb(this,(this->support_end)._M_node);
          this->fsize = this->fsize + -1;
          pivot_move_to_front(this,pit);
        }
      }
    }
LAB_0010e136:
    bVar3 = this->current_sqr_r <= NVar10;
    NVar10 = this->current_sqr_r;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void Miniball<CoordAccessor>::pivot_mb (Pit n)
    {
        // Algorithm 2: pivot_mb (L_{n-1}), where L_{n-1} = [L.begin, n)
        // --------------------------------------------------------------
        // from B. Gaertner, Fast and Robust Smallest Enclosing Balls, ESA 1999,
        // http://www.inf.ethz.ch/personal/gaertner/texts/own_work/esa99_final.pdf
        NT          old_sqr_r;
        const NT*   c;
        Pit         pivot, k;
        NT          e, max_e, sqr_r;
        Cit p;
        do {
            old_sqr_r = current_sqr_r;
            sqr_r = current_sqr_r;

            pivot = points_begin;
            max_e = nt0;
            for (k = points_begin; k != n; ++k) {
                p = coord_accessor(k);
                e = -sqr_r;
                c = current_c;
                for (int j=0; j<d; ++j)
                    e += mb_sqr<NT>(*p++-*c++);
                if (e > max_e) {
                    max_e = e;
                    pivot = k;
                }
            }

            if (max_e > nt0) {
                // check if the pivot is already contained in the support set
                if (std::find(L.begin(), support_end, pivot) == support_end) {
                    assert (fsize == 0);
                    if (push (pivot)) {
                        mtf_mb(support_end);
                        pop();
                        pivot_move_to_front(pivot);
                    }
                }
            }
        } while (old_sqr_r < current_sqr_r);
    }